

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O2

void GPU_MatrixFrustum(float *result,float left,float right,float bottom,float top,float z_near,
                      float z_far)

{
  float in_XMM0_Db;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float in_XMM1_Db;
  float in_XMM2_Db;
  float in_XMM3_Db;
  float local_48 [6];
  undefined8 local_30;
  undefined8 uStack_28;
  float local_20;
  undefined8 local_1c;
  undefined4 local_14;
  float local_10;
  undefined4 local_c;
  
  if (result != (float *)0x0) {
    local_48[0] = (z_near + z_near) / (right - left);
    auVar1._0_4_ = left + right;
    auVar1._4_4_ = bottom + top;
    auVar1._8_4_ = in_XMM0_Db + in_XMM1_Db;
    auVar1._12_4_ = in_XMM2_Db + in_XMM3_Db;
    auVar2._4_4_ = top - bottom;
    auVar2._0_4_ = right - left;
    auVar2._8_4_ = in_XMM1_Db - in_XMM0_Db;
    auVar2._12_4_ = in_XMM3_Db - in_XMM2_Db;
    auVar2 = divps(auVar1,auVar2);
    local_48[5] = (z_near + z_near) / (top - bottom);
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    local_48[4] = 0.0;
    uStack_28 = auVar2._0_8_;
    local_30 = 0;
    local_20 = -(z_near + z_far) / (z_far - z_near);
    local_1c = 0xbf800000;
    local_14 = 0;
    local_10 = (z_far * -2.0 * z_near) / (z_far - z_near);
    local_c = 0;
    GPU_MultiplyAndAssign(result,local_48);
  }
  return;
}

Assistant:

void GPU_MatrixFrustum(float* result, float left, float right, float bottom, float top, float z_near, float z_far)
{
    if(result == NULL)
		return;

	{
		float A[16];
		FILL_MATRIX_4x4(A, 
				2 * z_near / (right - left), 0, 0, 0,
				0, 2 * z_near / (top - bottom), 0, 0,
				(right + left) / (right - left), (top + bottom) / (top - bottom), -(z_far + z_near) / (z_far - z_near), -1,
				0, 0, -(2 * z_far * z_near) / (z_far - z_near), 0
			);

		GPU_MultiplyAndAssign(result, A);
	}
}